

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

uchar BinarySource_get_byte(BinarySource *src)

{
  size_t sVar1;
  
  if (src->err == BSE_NO_ERROR) {
    sVar1 = src->pos;
    if (src->len != sVar1) {
      src->pos = sVar1 + 1;
      return *(uchar *)((long)src->data + sVar1);
    }
    src->err = BSE_OUT_OF_DATA;
  }
  return '\0';
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}